

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdGetTaprootScriptTreeHash
              (void *handle,void *tree_handle,char *internal_pubkey,char **hash,char **tap_leaf_hash
              ,char **control_block)

{
  bool bVar1;
  undefined8 uVar2;
  reference object;
  undefined8 *in_RCX;
  char *in_RDX;
  string *in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  ByteData control;
  SchnorrPubkey tapscript_hash;
  value_type *tree;
  TapBranch branch;
  CfdCapiTapscriptTree *buffer;
  char *work_control_block;
  char *work_tap_leaf_hash;
  char *work_hash;
  int result;
  size_type in_stack_fffffffffffffd38;
  TapBranch *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd60;
  string *message;
  string local_240;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  SchnorrPubkey local_1d8;
  string *in_stack_fffffffffffffe48;
  pointer in_stack_fffffffffffffe50;
  SchnorrPubkey local_1a8;
  ByteData256 local_190;
  string local_178;
  reference local_158;
  TapBranch local_150;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  CfdSourceLocation local_b0;
  string *local_98;
  allocator local_89;
  string local_88 [48];
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  char *local_20;
  string *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  message = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"TapscriptTree",&local_89);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_98 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    cfd::core::TapBranch::TapBranch(&local_150);
    bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                      (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                        ((long)&local_98->field_2 + 8));
    if (bVar1) {
      local_158 = std::
                  vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                  ::at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                        *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      if (local_30 != (undefined8 *)0x0) {
        cfd::core::TaprootScriptTree::GetTapLeafHash(&local_190,local_158);
        cfd::core::ByteData256::GetHex_abi_cxx11_(&local_178,&local_190);
        local_50 = cfd::capi::CreateString(message);
        std::__cxx11::string::~string((string *)&local_178);
        cfd::core::ByteData256::~ByteData256((ByteData256 *)0x59e0a7);
      }
      cfd::core::TapBranch::operator=(&local_150,&local_158->super_TapBranch);
    }
    else {
      object = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                         ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                          in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      cfd::core::TapBranch::operator=(&local_150,object);
    }
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,local_20,&local_1f9);
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_1d8,&local_1f8);
    cfd::core::TaprootUtil::CreateTapScriptControl
              ((ByteData *)&stack0xfffffffffffffe40,&local_1d8,&local_150,&local_1a8,(Script *)0x0);
    cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x59e1a2);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    if (local_28 != (undefined8 *)0x0) {
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_220,&local_1a8);
      local_48 = cfd::capi::CreateString(message);
      std::__cxx11::string::~string((string *)&local_220);
    }
    if (local_38 != (undefined8 *)0x0) {
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_240,(ByteData *)&stack0xfffffffffffffe40);
      local_58 = cfd::capi::CreateString(message);
      std::__cxx11::string::~string((string *)&local_240);
    }
    if (local_28 != (undefined8 *)0x0) {
      *local_28 = local_48;
    }
    if ((local_30 != (undefined8 *)0x0) && (local_50 != (char *)0x0)) {
      *local_30 = local_50;
    }
    if (local_38 != (undefined8 *)0x0) {
      *local_38 = local_58;
    }
    local_4 = 0;
    cfd::core::ByteData::~ByteData((ByteData *)0x59e3b5);
    cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x59e3c2);
    cfd::core::TapBranch::~TapBranch(in_stack_fffffffffffffd40);
    return local_4;
  }
  local_b0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_script.cpp"
               ,0x2f);
  local_b0.filename = local_b0.filename + 1;
  local_b0.line = 0x415;
  local_b0.funcname = "CfdGetTaprootScriptTreeHash";
  cfd::core::logger::warn<>(&local_b0,"internal_pubkey is null or empty.");
  local_d2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,"Failed to parameter. internal_pubkey is null or empty.",&local_d1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffd60,error_code,in_stack_fffffffffffffd50);
  local_d2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTaprootScriptTreeHash(
    void* handle, void* tree_handle, const char* internal_pubkey, char** hash,
    char** tap_leaf_hash, char** control_block) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_hash = nullptr;
  char* work_tap_leaf_hash = nullptr;
  char* work_control_block = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (IsEmptyString(internal_pubkey)) {
      warn(CFD_LOG_SOURCE, "internal_pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. internal_pubkey is null or empty.");
    }
    TapBranch branch;
    if (!buffer->branch_buffer->empty()) {
      branch = buffer->branch_buffer->at(0);
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(tree.GetTapLeafHash().GetHex());
      }
      branch = tree;
    }
    SchnorrPubkey tapscript_hash;
    auto control = TaprootUtil::CreateTapScriptControl(
        SchnorrPubkey(internal_pubkey), branch, &tapscript_hash);

    if (hash != nullptr) {
      work_hash = CreateString(tapscript_hash.GetHex());
    }
    if (control_block != nullptr) {
      work_control_block = CreateString(control.GetHex());
    }

    if (hash != nullptr) *hash = work_hash;
    if ((tap_leaf_hash != nullptr) && (work_tap_leaf_hash != nullptr)) {
      *tap_leaf_hash = work_tap_leaf_hash;
    }
    if (control_block != nullptr) *control_block = work_control_block;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_hash, &work_tap_leaf_hash, &work_control_block);
  return result;
}